

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  int in_ESI;
  long in_RDI;
  ImVec2 min;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ImVec2 local_24 [2];
  ImRect local_10;
  
  if (in_ESI == 0) {
    local_10 = ImGuiWindow::Rect((ImGuiWindow *)0x1470ee);
  }
  else if (in_ESI == 1) {
    local_10 = *(ImRect *)(in_RDI + 0x200);
  }
  else if (in_ESI == 2) {
    local_10 = *(ImRect *)(in_RDI + 0x210);
  }
  else if (in_ESI == 3) {
    local_10 = *(ImRect *)(in_RDI + 0x220);
  }
  else if (in_ESI == 4) {
    local_10 = *(ImRect *)(in_RDI + 0x230);
  }
  else if (in_ESI == 5) {
    operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
              (ImVec2 *)0x1471c2);
    local_24[0] = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (ImVec2 *)0x1471db);
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
              (ImVec2 *)0x1471f4);
    ImRect::ImRect(&local_10,local_24,(ImVec2 *)&stack0xffffffffffffffcc);
  }
  else if (in_ESI == 6) {
    local_10 = *(ImRect *)(in_RDI + 0x260);
  }
  else {
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  return local_10;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }